

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O3

int __thiscall MeCab::Viterbi::open(Viterbi *this,char *__file,int __oflag,...)

{
  Tokenizer<mecab_node_t,_mecab_path_t> *pTVar1;
  Connector *pCVar2;
  int iVar3;
  int iVar4;
  Tokenizer<mecab_node_t,_mecab_path_t> *this_00;
  DictionaryInfo *pDVar5;
  Connector *this_01;
  size_t sVar6;
  ostream *poVar7;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  long lVar8;
  undefined8 unaff_RBP;
  char *pcVar9;
  whatlog *pwVar10;
  
  this_00 = (Tokenizer<mecab_node_t,_mecab_path_t> *)operator_new(0x678);
  Tokenizer<mecab_node_t,_mecab_path_t>::Tokenizer(this_00);
  pTVar1 = (this->tokenizer_).ptr_;
  iVar3 = extraout_EDX;
  if (pTVar1 != (Tokenizer<mecab_node_t,_mecab_path_t> *)0x0) {
    (*pTVar1->_vptr_Tokenizer[1])();
    iVar3 = extraout_EDX_00;
  }
  (this->tokenizer_).ptr_ = this_00;
  iVar3 = Tokenizer<mecab_node_t,_mecab_path_t>::open(this_00,__file,iVar3);
  if ((char)iVar3 == '\0') {
    pwVar10 = &this->what_;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pwVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar10,"(",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)pwVar10,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"tokenizer_->open(param)",0x17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
    pwVar10 = &((this->tokenizer_).ptr_)->what_;
LAB_00152a50:
    pcVar9 = whatlog::str(pwVar10);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,sVar6);
    }
  }
  else {
    pDVar5 = Tokenizer<mecab_node_t,_mecab_path_t>::dictionary_info((this->tokenizer_).ptr_);
    if (pDVar5 == (DictionaryInfo *)0x0) {
      pwVar10 = &this->what_;
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pwVar10,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
                 ,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar10,"(",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)pwVar10,0x33);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"tokenizer_->dictionary_info()",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
      pcVar9 = "Dictionary is empty";
      lVar8 = 0x13;
    }
    else {
      this_01 = (Connector *)operator_new(0x1c0);
      Connector::Connector(this_01);
      pCVar2 = (this->connector_).ptr_;
      iVar3 = extraout_EDX_01;
      if (pCVar2 != (Connector *)0x0) {
        (*pCVar2->_vptr_Connector[1])();
        iVar3 = extraout_EDX_02;
      }
      (this->connector_).ptr_ = this_01;
      iVar3 = Connector::open(this_01,__file,iVar3);
      if ((char)iVar3 == '\0') {
        pwVar10 = &this->what_;
        std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pwVar10,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
                   ,0x6d);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar10,"(",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)pwVar10,0x36);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"connector_->open(param)",0x17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
        pwVar10 = &((this->connector_).ptr_)->what_;
        goto LAB_00152a50;
      }
      pDVar5 = Tokenizer<mecab_node_t,_mecab_path_t>::dictionary_info((this->tokenizer_).ptr_);
      if ((pDVar5->lsize == (uint)((this->connector_).ptr_)->lsize_) &&
         (pDVar5 = Tokenizer<mecab_node_t,_mecab_path_t>::dictionary_info((this->tokenizer_).ptr_),
         pDVar5->rsize == (uint)((this->connector_).ptr_)->rsize_)) {
        iVar4 = Param::get<int>((Param *)__file,"cost-factor");
        iVar3 = 800;
        if (iVar4 != 0) {
          iVar3 = iVar4;
        }
        this->cost_factor_ = iVar3;
        return (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      }
      pwVar10 = &this->what_;
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pwVar10,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
                 ,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar10,"(",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)pwVar10,0x3b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "tokenizer_->dictionary_info()->lsize == connector_->left_size() && tokenizer_->dictionary_info()->rsize == connector_->right_size()"
                 ,0x83);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
      pcVar9 = "Transition table and dictionary are not compatible";
      lVar8 = 0x32;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,lVar8);
  }
  return 0;
}

Assistant:

bool Viterbi::open(const Param &param) {
  tokenizer_.reset(new Tokenizer<Node, Path>);
  CHECK_FALSE(tokenizer_->open(param)) << tokenizer_->what();
  CHECK_FALSE(tokenizer_->dictionary_info()) << "Dictionary is empty";

  connector_.reset(new Connector);
  CHECK_FALSE(connector_->open(param)) << connector_->what();

  CHECK_FALSE(tokenizer_->dictionary_info()->lsize ==
              connector_->left_size() &&
              tokenizer_->dictionary_info()->rsize ==
              connector_->right_size())
      << "Transition table and dictionary are not compatible";

  cost_factor_ = param.get<int>("cost-factor");
  if (cost_factor_ == 0) {
    cost_factor_ = 800;
  }

  return true;
}